

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  undefined4 uVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  ulong size;
  int iVar16;
  size_t size_00;
  int a;
  ulong uVar17;
  size_t size_01;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_scan_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_nw_stats_rowcol_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_rowcol_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_nw_stats_rowcol_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_rowcol_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_scan_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar17 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_nw_stats_rowcol_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_0055db5b;
  }
  uVar17 = (ulong)(uint)matrix->length;
LAB_0055db5b:
  a = (int)uVar17;
  ppVar3 = parasail_result_new_rowcol3(a,s2Len);
  if (ppVar3 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar3->flag = ppVar3->flag | 0x1450201;
  size_00 = (size_t)a;
  ptr = parasail_memalign_int(0x10,size_00);
  size = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,size);
  size_01 = (size_t)(a + 1);
  ptr_01 = parasail_memalign_int(0x10,size_01);
  ptr_02 = parasail_memalign_int(0x10,size_01);
  ptr_03 = parasail_memalign_int(0x10,size_01);
  ptr_04 = parasail_memalign_int(0x10,size_01);
  ptr_05 = parasail_memalign_int(0x10,size_00);
  ptr_06 = parasail_memalign_int(0x10,size_00);
  ptr_07 = parasail_memalign_int(0x10,size_00);
  ptr_08 = parasail_memalign_int(0x10,size_00);
  ptr_09 = parasail_memalign_int(0x10,size_01);
  ptr_10 = parasail_memalign_int(0x10,size_01);
  ptr_11 = parasail_memalign_int(0x10,size_01);
  ptr_12 = parasail_memalign_int(0x10,size_01);
  ptr_13 = parasail_memalign_int(0x10,size_00);
  auVar19._0_4_ = -(uint)((int)ptr == 0);
  auVar19._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar19._8_4_ = -(uint)((int)ptr_00 == 0);
  auVar19._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar25._4_4_ = auVar19._0_4_;
  auVar25._0_4_ = auVar19._4_4_;
  auVar25._8_4_ = auVar19._12_4_;
  auVar25._12_4_ = auVar19._8_4_;
  auVar21._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar21._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar21._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar21._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar26._4_4_ = auVar21._0_4_;
  auVar26._0_4_ = auVar21._4_4_;
  auVar26._8_4_ = auVar21._12_4_;
  auVar26._12_4_ = auVar21._8_4_;
  auVar26 = packssdw(auVar25 & auVar19,auVar26 & auVar21);
  auVar23._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar23._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar23._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar23._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar18._4_4_ = auVar23._0_4_;
  auVar18._0_4_ = auVar23._4_4_;
  auVar18._8_4_ = auVar23._12_4_;
  auVar18._12_4_ = auVar23._8_4_;
  auVar24._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar24._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar24._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar24._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar22._4_4_ = auVar24._0_4_;
  auVar22._0_4_ = auVar24._4_4_;
  auVar22._8_4_ = auVar24._12_4_;
  auVar22._12_4_ = auVar24._8_4_;
  auVar19 = packssdw(auVar18 & auVar23,auVar22 & auVar24);
  auVar19 = packssdw(auVar26,auVar19);
  if ((((((((auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar19 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar19 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  auVar20._0_4_ = -(uint)((int)((ulong)ptr_07 >> 0x20) == 0 && (int)ptr_07 == 0);
  auVar20._4_4_ = -(uint)((int)ptr_08 == 0 && (int)((ulong)ptr_08 >> 0x20) == 0);
  auVar20._8_4_ = -(uint)((int)((ulong)ptr_09 >> 0x20) == 0 && (int)ptr_09 == 0);
  auVar20._12_4_ = -(uint)((int)ptr_10 == 0 && (int)((ulong)ptr_10 >> 0x20) == 0);
  uVar2 = movmskps((int)ptr_10,auVar20);
  if ((char)uVar2 != '\0') {
    return (parasail_result_t *)0x0;
  }
  if (ptr_11 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_12 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_13 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (0 < a) {
    piVar9 = matrix->mapper;
    uVar8 = 0;
    do {
      ptr[uVar8] = piVar9[(byte)_s1[uVar8]];
      uVar8 = uVar8 + 1;
    } while (uVar17 != uVar8);
  }
  piVar11 = ptr_04 + 1;
  piVar9 = matrix->mapper;
  uVar8 = 0;
  do {
    ptr_00[uVar8] = piVar9[(byte)_s2[uVar8]];
    uVar8 = uVar8 + 1;
  } while (size != uVar8);
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_09 = 0;
  if (0 < a) {
    iVar5 = -open;
    uVar8 = 0;
    do {
      ptr_01[uVar8 + 1] = iVar5;
      ptr_02[uVar8 + 1] = 0;
      ptr_03[uVar8 + 1] = 0;
      piVar11[uVar8] = 0;
      uVar8 = uVar8 + 1;
      iVar5 = iVar5 - gap;
    } while (uVar17 != uVar8);
    if (0 < a) {
      uVar8 = 0;
      do {
        ptr_05[uVar8] = -0x40000000;
        ptr_06[uVar8] = 0;
        ptr_07[uVar8] = 0;
        ptr_08[uVar8] = 0;
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
    }
  }
  iVar5 = a + -1;
  lVar1 = uVar17 * 4;
  uVar8 = 0;
  do {
    if (a < 1) {
      iVar6 = -((int)uVar8 * gap + open);
      *ptr_09 = iVar6;
LAB_0055e236:
      *ptr_01 = iVar6;
    }
    else {
      lVar4 = 0;
      do {
        iVar6 = *(int *)((long)ptr_01 + lVar4 + 4) - open;
        iVar12 = *(int *)((long)ptr_05 + lVar4) - gap;
        if (iVar12 < iVar6) {
          *(int *)((long)ptr_05 + lVar4) = iVar6;
          *(undefined4 *)((long)ptr_06 + lVar4) = *(undefined4 *)((long)ptr_02 + lVar4 + 4);
          *(undefined4 *)((long)ptr_07 + lVar4) = *(undefined4 *)((long)ptr_03 + lVar4 + 4);
          piVar9 = piVar11;
        }
        else {
          *(int *)((long)ptr_05 + lVar4) = iVar12;
          piVar9 = ptr_08;
        }
        *(int *)((long)ptr_08 + lVar4) = *(int *)((long)piVar9 + lVar4) + 1;
        lVar4 = lVar4 + 4;
      } while (lVar1 - lVar4 != 0);
      iVar6 = -((int)uVar8 * gap + open);
      *ptr_09 = iVar6;
      if (a < 1) goto LAB_0055e236;
      piVar9 = matrix->matrix;
      uVar10 = 0;
      do {
        if (matrix->type == 0) {
          iVar12 = ptr[uVar10];
        }
        else {
          iVar12 = (int)uVar10;
        }
        iVar12 = piVar9[(long)(matrix->size * iVar12) + (long)ptr_00[uVar8]];
        iVar16 = ptr_01[uVar10] + iVar12;
        ptr_13[uVar10] = (uint)(iVar16 < ptr_05[uVar10]);
        if (iVar16 < ptr_05[uVar10]) {
          ptr_09[uVar10 + 1] = ptr_05[uVar10];
          ptr_10[uVar10 + 1] = ptr_06[uVar10];
          ptr_11[uVar10 + 1] = ptr_07[uVar10];
          iVar12 = ptr_08[uVar10];
        }
        else {
          ptr_09[uVar10 + 1] = iVar16;
          ptr_10[uVar10 + 1] = (uint)(ptr[uVar10] == ptr_00[uVar8]) + ptr_02[uVar10];
          ptr_11[uVar10 + 1] = (uint)(0 < iVar12) + ptr_03[uVar10];
          iVar12 = ptr_04[uVar10] + 1;
        }
        ptr_12[uVar10 + 1] = iVar12;
        uVar10 = uVar10 + 1;
      } while (uVar17 != uVar10);
      if (a < 1) goto LAB_0055e236;
      iVar16 = -0x40000000;
      lVar4 = 0;
      iVar12 = 0;
      uVar7 = 0;
      uVar2 = 0;
      do {
        iVar13 = iVar16 - gap;
        iVar16 = *(int *)((long)ptr_09 + lVar4);
        if (*(int *)((long)ptr_09 + lVar4) <= iVar13) {
          iVar16 = iVar13;
        }
        if (iVar13 < *(int *)((long)ptr_01 + lVar4)) {
          uVar2 = *(undefined4 *)((long)ptr_02 + lVar4);
          uVar7 = *(undefined4 *)((long)ptr_03 + lVar4);
          iVar12 = *(int *)((long)ptr_04 + lVar4);
        }
        iVar14 = iVar16 - open;
        iVar12 = iVar12 + 1;
        iVar13 = *(int *)((long)ptr_09 + lVar4 + 4);
        if (iVar14 < iVar13) {
          *(int *)((long)ptr_01 + lVar4 + 4) = iVar13;
          *(undefined4 *)((long)ptr_02 + lVar4 + 4) = *(undefined4 *)((long)ptr_10 + lVar4 + 4);
          uVar15 = *(undefined4 *)((long)ptr_11 + lVar4 + 4);
LAB_0055e115:
          *(undefined4 *)((long)ptr_03 + lVar4 + 4) = uVar15;
          iVar13 = *(int *)((long)ptr_12 + lVar4 + 4);
        }
        else {
          *(int *)((long)ptr_01 + lVar4 + 4) = iVar14;
          if (*(int *)((long)ptr_09 + lVar4 + 4) == iVar14) {
            if (*(int *)((long)ptr_13 + lVar4) == 0) {
              *(undefined4 *)((long)ptr_02 + lVar4 + 4) = *(undefined4 *)((long)ptr_10 + lVar4 + 4);
              uVar15 = *(undefined4 *)((long)ptr_11 + lVar4 + 4);
              goto LAB_0055e115;
            }
            *(undefined4 *)((long)ptr_02 + lVar4 + 4) = uVar2;
          }
          else {
            *(undefined4 *)((long)ptr_02 + lVar4 + 4) = uVar2;
          }
          *(undefined4 *)((long)ptr_03 + lVar4 + 4) = uVar7;
          iVar13 = iVar12;
        }
        *(int *)((long)piVar11 + lVar4) = iVar13;
        lVar4 = lVar4 + 4;
      } while (lVar1 - lVar4 != 0);
      *ptr_01 = iVar6;
      if (uVar8 == s2Len - 1U && 0 < a) {
        lVar4 = 0;
        do {
          *(undefined4 *)
           (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x20) + lVar4) =
               *(undefined4 *)((long)ptr_01 + lVar4 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x28) + lVar4) =
               *(undefined4 *)((long)ptr_02 + lVar4 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x30) + lVar4) =
               *(undefined4 *)((long)ptr_03 + lVar4 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x38) + lVar4) =
               *(undefined4 *)((long)piVar11 + lVar4);
          lVar4 = lVar4 + 4;
        } while (lVar1 - lVar4 != 0);
      }
    }
    *(int *)(*((ppVar3->field_4).trace)->trace_del_table + uVar8 * 4) = ptr_01[(long)iVar5 + 1];
    *(int *)(*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 8) + uVar8 * 4) =
         ptr_02[(long)iVar5 + 1];
    *(int *)(*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x10) + uVar8 * 4) =
         ptr_03[(long)iVar5 + 1];
    *(int *)(*(long *)((long)((ppVar3->field_4).trace)->trace_del_table + 0x18) + uVar8 * 4) =
         piVar11[iVar5];
    uVar8 = uVar8 + 1;
    if (uVar8 == size) {
      ppVar3->score = ptr_01[(long)iVar5 + 1];
      ppVar3->end_query = iVar5;
      ppVar3->end_ref = s2Len - 1U;
      ((ppVar3->field_4).stats)->matches = ptr_02[(long)iVar5 + 1];
      ((ppVar3->field_4).stats)->similar = ptr_03[(long)iVar5 + 1];
      ((ppVar3->field_4).stats)->length = ptr_04[(long)iVar5 + 1];
      parasail_free(ptr_13);
      parasail_free(ptr_12);
      parasail_free(ptr_11);
      parasail_free(ptr_10);
      parasail_free(ptr_09);
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar3;
    }
  } while( true );
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = -open - i*gap;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = -open -j*gap;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1] + 1;
            }
            else {
                FtL = FtL + 1;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = -open - j*gap;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = H[s1Len-1];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s1Len-1];
    result->stats->similar = HS[s1Len-1];
    result->stats->length = HL[s1Len-1];

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}